

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
DescriptorKeyInfo_Constructor_Privkey_Testnet_Compress_Test::
~DescriptorKeyInfo_Constructor_Privkey_Testnet_Compress_Test
          (DescriptorKeyInfo_Constructor_Privkey_Testnet_Compress_Test *this)

{
  DescriptorKeyInfo_Constructor_Privkey_Testnet_Compress_Test *this_local;
  
  ~DescriptorKeyInfo_Constructor_Privkey_Testnet_Compress_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, Constructor_Privkey_Testnet_Compress) {
  Privkey privkey("0b64eb8f5ddfffed8ffd09339cbb9de1b9ceee2a76760173fe4b130a91e56383");
  std::string privkey_wif_str = "cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN";
  Privkey privkey_wif = Privkey::FromWif(privkey_wif_str, NetType::kRegtest, true);
  std::string parent_info = "[ef57314e/0'/0'/4']";
  DescriptorKeyInfo key_info;
  std::string key_str;

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(privkey, false));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), privkey.GetWif().c_str());
  EXPECT_EQ(key_info.GetKeyType(),  DescriptorKeyType::kDescriptorKeyPublic);

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(privkey_wif, true, NetType::kRegtest, true, parent_info));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), (parent_info + privkey_wif_str).c_str());
  EXPECT_TRUE(key_info.HasPrivkey());
  EXPECT_FALSE(key_info.HasExtPubkey());
  EXPECT_FALSE(key_info.HasExtPrivkey());
  EXPECT_STREQ(key_info.GetPrivkey().GetHex().c_str(),  privkey_wif.GetHex().c_str());
}